

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O2

void __thiscall
shift_window_transformer::WindowAttention<float>::~WindowAttention
          (WindowAttention<float> *this,void **vtt)

{
  void *pvVar1;
  Linear<float> *pLVar2;
  Tensor<float> *pTVar3;
  Tensor<int> *this_00;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  pLVar2 = this->qLinear;
  if (pLVar2 != (Linear<float> *)0x0) {
    Linear<float>::~Linear(pLVar2);
    operator_delete(pLVar2,0x28);
    this->qLinear = (Linear<float> *)0x0;
  }
  pLVar2 = this->kLinear;
  if (pLVar2 != (Linear<float> *)0x0) {
    Linear<float>::~Linear(pLVar2);
    operator_delete(pLVar2,0x28);
    this->kLinear = (Linear<float> *)0x0;
  }
  pLVar2 = this->vLinear;
  if (pLVar2 != (Linear<float> *)0x0) {
    Linear<float>::~Linear(pLVar2);
    operator_delete(pLVar2,0x28);
    this->vLinear = (Linear<float> *)0x0;
  }
  pLVar2 = this->outLinear;
  if (pLVar2 != (Linear<float> *)0x0) {
    Linear<float>::~Linear(pLVar2);
    operator_delete(pLVar2,0x28);
    this->outLinear = (Linear<float> *)0x0;
  }
  pTVar3 = this->upperLowerMask;
  if (pTVar3 != (Tensor<float> *)0x0) {
    Tensor<float>::~Tensor(pTVar3);
    operator_delete(pTVar3,0x30);
    this->upperLowerMask = (Tensor<float> *)0x0;
  }
  pTVar3 = this->leftRightMask;
  if (pTVar3 != (Tensor<float> *)0x0) {
    Tensor<float>::~Tensor(pTVar3);
    operator_delete(pTVar3,0x30);
    this->leftRightMask = (Tensor<float> *)0x0;
  }
  this_00 = this->relativeIndices;
  if (this_00 != (Tensor<int> *)0x0) {
    Tensor<int>::~Tensor(this_00);
    operator_delete(this_00,0x30);
    this->relativeIndices = (Tensor<int> *)0x0;
  }
  pTVar3 = this->posEmbedding;
  if (pTVar3 != (Tensor<float> *)0x0) {
    Tensor<float>::~Tensor(pTVar3);
    operator_delete(pTVar3,0x30);
    this->posEmbedding = (Tensor<float> *)0x0;
  }
  if (this->cyclicShift != (CyclicShift<float> *)0x0) {
    operator_delete(this->cyclicShift,0x10);
    this->cyclicShift = (CyclicShift<float> *)0x0;
  }
  if (this->cyclicBackShift != (CyclicShift<float> *)0x0) {
    operator_delete(this->cyclicBackShift,0x10);
    this->cyclicBackShift = (CyclicShift<float> *)0x0;
  }
  return;
}

Assistant:

~WindowAttention() {
            if (qLinear != nullptr) {
                delete qLinear;
                qLinear = nullptr;
            }
            if (kLinear != nullptr) {
                delete kLinear;
                kLinear = nullptr;
            }
            if (vLinear != nullptr) {
                delete vLinear;
                vLinear = nullptr;
            }
            if (outLinear != nullptr) {
                delete outLinear;
                outLinear = nullptr;
            }
            if (upperLowerMask != nullptr) {
                delete upperLowerMask;
                upperLowerMask = nullptr;
            }
            if (leftRightMask != nullptr) {
                delete leftRightMask;
                leftRightMask = nullptr;
            }
            if (relativeIndices != nullptr) {
                delete relativeIndices;
                relativeIndices = nullptr;
            }
            if (posEmbedding != nullptr) {
                delete posEmbedding;
                posEmbedding = nullptr;
            }
            if (cyclicShift != nullptr) {
                delete cyclicShift;
                cyclicShift = nullptr;
            }
            if (cyclicBackShift != nullptr) {
                delete cyclicBackShift;
                cyclicBackShift = nullptr;
            }
        }